

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmBlock::DetachInstruction(VmBlock *this,VmInstruction *instruction)

{
  VmInstruction *pVVar1;
  VmInstruction *pVVar2;
  
  if (instruction == (VmInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x7f2,"void VmBlock::DetachInstruction(VmInstruction *)");
  }
  if (instruction->parent == this) {
    if (this->firstInstruction == instruction) {
      this->firstInstruction = instruction->nextSibling;
    }
    pVVar1 = instruction->prevSibling;
    if (this->lastInstruction == instruction) {
      this->lastInstruction = pVVar1;
    }
    pVVar2 = instruction->nextSibling;
    if (pVVar1 != (VmInstruction *)0x0) {
      pVVar1->nextSibling = pVVar2;
    }
    if (pVVar2 != (VmInstruction *)0x0) {
      pVVar2->prevSibling = pVVar1;
    }
    instruction->parent = (VmBlock *)0x0;
    instruction->prevSibling = (VmInstruction *)0x0;
    instruction->nextSibling = (VmInstruction *)0x0;
    return;
  }
  __assert_fail("instruction->parent == this",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x7f3,"void VmBlock::DetachInstruction(VmInstruction *)");
}

Assistant:

void VmBlock::DetachInstruction(VmInstruction* instruction)
{
	assert(instruction);
	assert(instruction->parent == this);

	if(instruction == firstInstruction)
		firstInstruction = instruction->nextSibling;

	if(instruction == lastInstruction)
		lastInstruction = instruction->prevSibling;

	if(instruction->prevSibling)
		instruction->prevSibling->nextSibling = instruction->nextSibling;
	if(instruction->nextSibling)
		instruction->nextSibling->prevSibling = instruction->prevSibling;

	instruction->parent = NULL;
	instruction->prevSibling = NULL;
	instruction->nextSibling = NULL;
}